

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Runner2::Runner2(Runner2 *this,Config *configWrapper)

{
  _Rb_tree_header *p_Var1;
  
  this->m_configWrapper = configWrapper;
  this->m_config = &configWrapper->m_data;
  std::ofstream::ofstream(&this->m_ofs);
  (this->m_reporter).m_p = (IReporter *)0x0;
  p_Var1 = &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  openStream(this);
  makeReporter(this);
  return;
}

Assistant:

Runner2( Config& configWrapper )
        :   m_configWrapper( configWrapper ),
            m_config( configWrapper.data() )
        {
            openStream();
            makeReporter();
        }